

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# UdpComms.cpp
# Opt level: O2

void __thiscall helics::udp::UdpComms::~UdpComms(UdpComms *this)

{
  CommsInterface::disconnect((CommsInterface *)this);
  CLI::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
             &(this->futurePort).super___basic_future<int>._M_state.
              super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::promise<int>::~promise(&this->promisePort);
  NetworkCommsInterface::~NetworkCommsInterface(&this->super_NetworkCommsInterface);
  return;
}

Assistant:

UdpComms::~UdpComms()
{
    disconnect();
}